

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bytedata256.cpp
# Opt level: O1

void __thiscall
ByteData256_BytesConstructorException_Test::TestBody
          (ByteData256_BytesConstructorException_Test *this)

{
  bool bVar1;
  value_type_conflict *__val;
  char *in_R9;
  ByteData256 byte_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> target;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  AssertHelper local_58;
  ByteData256 local_50;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)0x0;
  local_38._M_string_length = 0;
  local_38.field_2._M_allocated_capacity = 0;
  local_38._M_dataplus._M_p = (pointer)operator_new(0x19);
  local_38._M_string_length = (size_type)(local_38._M_dataplus._M_p + 0x19);
  local_38._M_dataplus._M_p[9] = '\0';
  local_38._M_dataplus._M_p[10] = '\0';
  local_38._M_dataplus._M_p[0xb] = '\0';
  local_38._M_dataplus._M_p[0xc] = '\0';
  local_38._M_dataplus._M_p[0xd] = '\0';
  local_38._M_dataplus._M_p[0xe] = '\0';
  local_38._M_dataplus._M_p[0xf] = '\0';
  local_38._M_dataplus._M_p[0x10] = '\0';
  local_38._M_dataplus._M_p[0x11] = '\0';
  local_38._M_dataplus._M_p[0x12] = '\0';
  local_38._M_dataplus._M_p[0x13] = '\0';
  local_38._M_dataplus._M_p[0x14] = '\0';
  local_38._M_dataplus._M_p[0x15] = '\0';
  local_38._M_dataplus._M_p[0x16] = '\0';
  local_38._M_dataplus._M_p[0x17] = '\0';
  local_38._M_dataplus._M_p[0x18] = '\0';
  local_38._M_dataplus._M_p[0] = '\0';
  local_38._M_dataplus._M_p[1] = '\0';
  local_38._M_dataplus._M_p[2] = '\0';
  local_38._M_dataplus._M_p[3] = '\0';
  local_38._M_dataplus._M_p[4] = '\0';
  local_38._M_dataplus._M_p[5] = '\0';
  local_38._M_dataplus._M_p[6] = '\0';
  local_38._M_dataplus._M_p[7] = '\0';
  local_38._M_dataplus._M_p[8] = '\0';
  local_38._M_dataplus._M_p[9] = '\0';
  local_38._M_dataplus._M_p[10] = '\0';
  local_38._M_dataplus._M_p[0xb] = '\0';
  local_38._M_dataplus._M_p[0xc] = '\0';
  local_38._M_dataplus._M_p[0xd] = '\0';
  local_38._M_dataplus._M_p[0xe] = '\0';
  local_38._M_dataplus._M_p[0xf] = '\0';
  local_38.field_2._M_allocated_capacity = local_38._M_string_length;
  cfd::core::ByteData256::ByteData256
            (&local_50,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_38);
  if ((void *)CONCAT71(local_50.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start._1_7_,
                       local_50.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start._0_1_) != (void *)0x0) {
    operator_delete((void *)CONCAT71(local_50.data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                     local_50.data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_1_));
  }
  if (local_38._M_dataplus._M_p != (char *)0x0) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  local_50.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = (internal)0x0;
  local_50.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  testing::Message::Message((Message *)&local_60);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            (&local_38,(internal *)&local_50,(AssertionResult *)0x4fd874,"false","true",in_R9);
  testing::internal::AssertHelper::AssertHelper
            (&local_58,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_bytedata256.cpp"
             ,0x68,local_38._M_dataplus._M_p);
  testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
  testing::internal::AssertHelper::~AssertHelper(&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  if (local_60.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       (local_60.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_60.ptr_ + 8))();
    }
    local_60.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_50.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(ByteData256, BytesConstructorException) {
  try {
    std::vector<uint8_t> target(25);
    ByteData256 byte_data = ByteData256(target);
  } catch (const cfd::core::CfdException &cfd_except) {
    EXPECT_STREQ(cfd_except.what(), "ByteData256 size unmatch.");
    return;
  }
  ASSERT_TRUE(false);
}